

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
imrt::ApertureILS::getShuffledIntensityNeighbors(ApertureILS *this,Plan *P)

{
  int iVar1;
  size_type sVar2;
  reference ppSVar3;
  Plan *in_RDX;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_RDI;
  double dVar4;
  int j;
  int i;
  iterator s;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *a_list;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  pair<int,_int> in_stack_ffffffffffffff30;
  pair<int,_int> in_stack_ffffffffffffff48;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_ffffffffffffff50;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *this_00;
  int local_50;
  int local_4c;
  _List_iterator<imrt::Station_*> local_40;
  undefined1 local_31;
  
  this_00 = in_RDI;
  Plan::get_stations_abi_cxx11_(in_RDX);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list(this_00,in_RDI);
  local_31 = 0;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1611cb);
  std::_List_iterator<imrt::Station_*>::_List_iterator(&local_40);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin
                 ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  for (local_4c = 0;
      sVar2 = std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::size
                        ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                         in_stack_ffffffffffffff30), (ulong)(long)local_4c < sVar2;
      local_4c = local_4c + 1) {
    local_50 = 0;
    while( true ) {
      ppSVar3 = std::_List_iterator<imrt::Station_*>::operator*
                          ((_List_iterator<imrt::Station_*> *)in_stack_ffffffffffffff30);
      iVar1 = Station::getNbApertures(*ppSVar3);
      if (iVar1 <= local_50) break;
      std::_List_iterator<imrt::Station_*>::operator*
                ((_List_iterator<imrt::Station_*> *)in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff50._M_current =
           (pair<int,_int> *)
           Station::getApertureIntensity
                     ((Station *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      if (0.0 < (double)in_stack_ffffffffffffff50._M_current) {
        in_stack_ffffffffffffff48 =
             std::make_pair<int&,int>
                       ((int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                        (int *)0x1612c6);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   in_stack_ffffffffffffff30,
                   (value_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
      std::_List_iterator<imrt::Station_*>::operator*
                ((_List_iterator<imrt::Station_*> *)in_stack_ffffffffffffff30);
      dVar4 = Station::getApertureIntensity
                        ((Station *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      ppSVar3 = std::_List_iterator<imrt::Station_*>::operator*
                          ((_List_iterator<imrt::Station_*> *)in_stack_ffffffffffffff30);
      iVar1 = Station::getMaxIntensity(*ppSVar3);
      if (dVar4 <= (double)iVar1) {
        in_stack_ffffffffffffff30 =
             std::make_pair<int&,int>
                       ((int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                        (int *)0x161389);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   in_stack_ffffffffffffff30,
                   (value_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
      local_50 = local_50 + 1;
    }
    std::advance<std::_List_iterator<imrt::Station*>,int>
              ((_List_iterator<imrt::Station_*> *)in_stack_ffffffffffffff50._M_current,
               in_stack_ffffffffffffff48.second);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            (in_stack_ffffffffffffff50,
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )in_stack_ffffffffffffff48);
  local_31 = 1;
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::~list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)0x161449);
  return (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)in_RDI;
}

Assistant:

vector < pair<int, int> > ApertureILS::getShuffledIntensityNeighbors(Plan &P){
  list<Station*> stations = P.get_stations();
  vector<pair<int, int>> a_list;
  list<Station*>::iterator s;
  s = stations.begin();
  for (int i = 0; i < stations.size(); i++) {
    for (int j = 0; j < (*s)->getNbApertures();j++){
      //One pair -j (-aperture) for reducing intensity
      //One pair for increasing intensity (+j)
      if ((*s)->getApertureIntensity(j) > 0)
        a_list.push_back(make_pair(i,-(j+1)));
      
      if ((*s)->getApertureIntensity(j) <= (*s)->getMaxIntensity())
        a_list.push_back(make_pair(i,(j+1)));
    }
    std::advance(s,1);
  }
  //cout << "Size neighborhood " << a_list.size()<< endl;
  std::random_shuffle(a_list.begin(), a_list.end());
  return(a_list);
}